

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O3

int SHA256_Update(SHA256_CTX *c,void *data,size_t len)

{
  int in_EAX;
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong __n;
  void *pvVar3;
  
  if (len == 0) {
    return in_EAX;
  }
  if ((c == (SHA256_CTX *)0x0) || (data == (void *)0x0)) {
    __assert_fail("context != (SHA256_CTX*)0 && data != (sha2_byte*)0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                  0x20e,"void SHA256_Update(SHA256_CTX *, const sha2_byte *, size_t)");
  }
  uVar1 = c->Nl >> 3 & 0x3f;
  if (uVar1 == 0) {
    iVar2 = 0;
  }
  else {
    __n = (ulong)(0x40 - uVar1);
    pvVar3 = (void *)((long)c->data + (ulong)uVar1);
    if (len < __n) {
      pvVar3 = memcpy(pvVar3,data,len);
      iVar2 = (int)pvVar3;
      goto LAB_0012d59b;
    }
    memcpy(pvVar3,data,__n);
    data = (void *)((long)data + __n);
    *(ulong *)&c->Nl = *(long *)&c->Nl + (ulong)((0x40 - uVar1) * 8);
    SHA256_Transform(c,(uchar *)c->data);
    len = len - __n;
    iVar2 = extraout_EAX;
  }
  for (; 0x3f < len; len = len - 0x40) {
    SHA256_Transform(c,(uchar *)data);
    *(long *)&c->Nl = *(long *)&c->Nl + 0x200;
    data = (void *)((long)data + 0x40);
    iVar2 = extraout_EAX_00;
  }
  if (len == 0) {
    return iVar2;
  }
  pvVar3 = memcpy(c->data,data,len);
  iVar2 = (int)pvVar3;
LAB_0012d59b:
  *(size_t *)&c->Nl = *(long *)&c->Nl + len * 8;
  return iVar2;
}

Assistant:

void SHA256_Update(SHA256_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA256_CTX*)0 && data != (sha2_byte*)0);

	usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA256_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, freespace);
			context->bitcount += freespace << 3;
			len -= freespace;
			data += freespace;
			SHA256_Transform(context, (sha2_word32*)context->buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, len);
			context->bitcount += len << 3;
			return;
		}
	}
	while (len >= SHA256_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		SHA256_Transform(context, (sha2_word32*)data);
		context->bitcount += SHA256_BLOCK_LENGTH << 3;
		len -= SHA256_BLOCK_LENGTH;
		data += SHA256_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		context->bitcount += len << 3;
	}
}